

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

quath tinyusdz::lerp<tinyusdz::value::quath>(quath *a,quath *b,double t)

{
  half hVar1;
  half hVar2;
  half hVar3;
  half hVar4;
  quatf qVar5;
  quatf bf;
  quatf af;
  float local_68;
  float fStack_64;
  float local_58;
  quatf local_40;
  quatf local_30;
  
  local_30.real = value::half_to_float((half)(a->real).value);
  local_30.imag._M_elems[0] = value::half_to_float((half)(a->imag)._M_elems[0].value);
  local_30.imag._M_elems[1] = value::half_to_float((half)(a->imag)._M_elems[1].value);
  local_30.imag._M_elems[2] = value::half_to_float((half)(a->imag)._M_elems[2].value);
  local_40.real = value::half_to_float((half)(b->real).value);
  local_40.imag._M_elems[0] = value::half_to_float((half)(b->imag)._M_elems[0].value);
  local_40.imag._M_elems[1] = value::half_to_float((half)(b->imag)._M_elems[1].value);
  local_40.imag._M_elems[2] = value::half_to_float((half)(b->imag)._M_elems[2].value);
  qVar5 = slerp(&local_30,&local_40,(float)t);
  hVar1 = value::float_to_half_full(qVar5.real);
  local_68 = qVar5.imag._M_elems[0];
  hVar2 = value::float_to_half_full(local_68);
  fStack_64 = qVar5.imag._M_elems[1];
  hVar3 = value::float_to_half_full(fStack_64);
  local_58 = qVar5.imag._M_elems[2];
  hVar4 = value::float_to_half_full(local_58);
  return (quath)((ulong)hVar2.value |
                (ulong)hVar3.value << 0x10 | (ulong)hVar4.value << 0x20 | (ulong)hVar1.value << 0x30
                );
}

Assistant:

inline value::quath lerp(const value::quath &a, const value::quath &b, const double t) {
  // to float.
  value::quatf af;
  value::quatf bf;
  af.real = half_to_float(a.real);
  af.imag[0] = half_to_float(a.imag[0]);
  af.imag[1] = half_to_float(a.imag[1]);
  af.imag[2] = half_to_float(a.imag[2]);

  bf.real = half_to_float(b.real);
  bf.imag[0] = half_to_float(b.imag[0]);
  bf.imag[1] = half_to_float(b.imag[1]);
  bf.imag[2] = half_to_float(b.imag[2]);

  value::quatf ret =  slerp(af, bf, float(t));
  value::quath h;
  h.real = value::float_to_half_full(ret.real);
  h.imag[0] = value::float_to_half_full(ret.imag[0]);
  h.imag[1] = value::float_to_half_full(ret.imag[1]);
  h.imag[2] = value::float_to_half_full(ret.imag[2]);

  return h;
}